

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_alloter.cpp
# Opt level: O0

void __thiscall cppnet::PoolAlloter::~PoolAlloter(PoolAlloter *this)

{
  bool bVar1;
  reference ppcVar2;
  element_type *peVar3;
  char *local_28;
  void *data;
  __normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> local_18;
  iterator iter;
  PoolAlloter *this_local;
  
  (this->super_Alloter)._vptr_Alloter = (_func_int **)&PTR__PoolAlloter_00166560;
  iter._M_current = (char **)this;
  local_18._M_current =
       (char **)std::vector<char_*,_std::allocator<char_*>_>::begin(&this->_malloc_vec);
  while( true ) {
    data = (void *)std::vector<char_*,_std::allocator<char_*>_>::end(&this->_malloc_vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_18,
                       (__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_> *)
                       &data);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::
              operator*(&local_18);
    if (*ppcVar2 != (char *)0x0) {
      ppcVar2 = __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>
                ::operator*(&local_18);
      local_28 = *ppcVar2;
      peVar3 = std::__shared_ptr_access<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<cppnet::Alloter,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&this->_alloter);
      (*peVar3->_vptr_Alloter[5])(peVar3,&local_28,0);
    }
    __gnu_cxx::__normal_iterator<char_**,_std::vector<char_*,_std::allocator<char_*>_>_>::operator++
              (&local_18);
  }
  std::shared_ptr<cppnet::Alloter>::~shared_ptr(&this->_alloter);
  std::vector<char_*,_std::allocator<char_*>_>::~vector(&this->_malloc_vec);
  std::vector<cppnet::PoolAlloter::MemNode_*,_std::allocator<cppnet::PoolAlloter::MemNode_*>_>::
  ~vector(&this->_free_list);
  Alloter::~Alloter(&this->super_Alloter);
  return;
}

Assistant:

PoolAlloter::~PoolAlloter() {
    for (auto iter = _malloc_vec.begin(); iter != _malloc_vec.end(); ++iter) {
        if (*iter) {
            void* data = (void*)*iter;
            _alloter->Free(data);
        }
    }
}